

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulate.h
# Opt level: O2

void __thiscall
snestistics::EmulateRegisters::special_write_a(EmulateRegisters *this,uint32_t r,uint8_t v)

{
  uint uVar1;
  uint uVar2;
  
  switch(r) {
  case 0x2180:
    uVar1 = this->_WRAM + 0x7e0000;
    if ((uVar1 & 0xfffe0000) != 0x7e0000) {
      __assert_fail("(target>>16)==0x7E||(target>>16)==0x7F",
                    "/workspace/llm4binary/github/license_c_cmakelists/breakin[P]snestistics/source/emulate.h"
                    ,0xfd,"void snestistics::EmulateRegisters::special_write_a(uint32_t, uint8_t)");
    }
    this->_memory[uVar1] = v;
    this->_WRAM = this->_WRAM + 1 & 0x1ffff;
    return;
  case 0x2181:
    uVar1 = this->_WRAM & 0x1ff00;
    uVar2 = (uint)v;
    break;
  case 0x2182:
    uVar1 = this->_WRAM & 0x100ff;
    uVar2 = (uint)v << 8;
    break;
  case 0x2183:
    *(ushort *)((long)&this->_WRAM + 2) = v & 1;
  default:
    return;
  }
  this->_WRAM = uVar2 | uVar1;
  return;
}

Assistant:

void special_write_a(uint32_t r, uint8_t v) {
		// TODO: This bypasses write_function, making rewind confused... Must make these writes trigger write_function!
		if (r == 0x2180) {
			// TODO: not if written because of dma transfer
			uint32_t target = 0x7E0000+_WRAM;
			CUSTOM_ASSERT((target>>16)==0x7E||(target>>16)==0x7F);
			_memory[target] = v;
			_WRAM++;
			_WRAM &= 0x1ffff;
		} else if (r == 0x2181) {
			// TODO: not if written because of dma transfer
			_WRAM &= 0x1FF00;
			_WRAM |= v;
		} else if (r == 0x2182) {
			// TODO: not if written because of dma transfer
			_WRAM &= 0x100FF;
			_WRAM |= v<<8;
		} else if (r == 0x2183) {
			// TODO: not if written because of dma transfer
			_WRAM &= 0x0FFFF;
			_WRAM |= v<<16;
			_WRAM &= 0x1FFFF;
		}
	}